

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void TestSuite::sleep_ms(size_t ms,string *msg)

{
  int iVar1;
  int *piVar2;
  timespec local_18;
  
  if (msg->_M_string_length != 0) {
    _msg("%s (%zu ms)\n",(msg->_M_dataplus)._M_p,ms);
  }
  if (0 < (long)ms) {
    local_18.tv_sec = ms / 1000;
    local_18.tv_nsec = (ms % 1000) * 1000000;
    do {
      iVar1 = nanosleep(&local_18,&local_18);
      if (iVar1 != -1) {
        return;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return;
}

Assistant:

static void sleep_ms(size_t ms, const std::string& msg = std::string()) {
        if (!msg.empty()) TestSuite::_msg("%s (%zu ms)\n", msg.c_str(), ms);
        std::this_thread::sleep_for(std::chrono::milliseconds(ms));
    }